

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

void __thiscall Liby::Buffer::resize(Buffer *this,off_t minSize)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  size_t __n;
  ulong uVar4;
  
  if (this->capacity_ <= minSize) {
    uVar4 = 0xffffffffffffffff;
    if (-1 < minSize) {
      uVar4 = minSize;
    }
    pcVar3 = (char *)operator_new__(uVar4);
    lVar1 = this->leftIndex_;
    pcVar2 = this->buffer_;
    __n = size(this);
    memcpy(pcVar3 + lVar1,pcVar2 + lVar1,__n);
    if (this->buffer_ != (char *)0x0) {
      operator_delete__(this->buffer_);
    }
    this->buffer_ = pcVar3;
    this->capacity_ = minSize;
  }
  return;
}

Assistant:

void Buffer::resize(off_t minSize) {
    if (minSize < capacity_)
        return;
    char *newBuffer = new char[minSize];
    ::memcpy(newBuffer + leftIndex_, buffer_ + leftIndex_, size());
    delete[] buffer_;
    buffer_ = newBuffer;
    capacity_ = minSize;
}